

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UBool __thiscall icu_63::Calendar::isWeekend(Calendar *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  UErrorCode status;
  
  status = U_ZERO_ERROR;
  uVar2 = get(this,UCAL_DAY_OF_WEEK,&status);
  iVar3 = (*(this->super_UObject)._vptr_UObject[0x18])(this,(ulong)uVar2,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar3 - 2U < 2) {
      iVar1 = this->fFields[0x15];
      iVar4 = (*(this->super_UObject)._vptr_UObject[0x19])(this,(ulong)uVar2,&status);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        return iVar1 < iVar4 != (iVar3 == 2);
      }
    }
    else if (iVar3 == 1) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
Calendar::isWeekend(void) const
{
    UErrorCode status = U_ZERO_ERROR;
    UCalendarDaysOfWeek dayOfWeek = (UCalendarDaysOfWeek)get(UCAL_DAY_OF_WEEK, status);
    UCalendarWeekdayType dayType = getDayOfWeekType(dayOfWeek, status);
    if (U_SUCCESS(status)) {
        switch (dayType) {
            case UCAL_WEEKDAY:
                return FALSE;
            case UCAL_WEEKEND:
                return TRUE;
            case UCAL_WEEKEND_ONSET:
            case UCAL_WEEKEND_CEASE:
                // Use internalGet() because the above call to get() populated all fields.
                {
                    int32_t millisInDay = internalGet(UCAL_MILLISECONDS_IN_DAY);
                    int32_t transitionMillis = getWeekendTransition(dayOfWeek, status);
                    if (U_SUCCESS(status)) {
                        return (dayType == UCAL_WEEKEND_ONSET)?
                            (millisInDay >= transitionMillis):
                            (millisInDay <  transitionMillis);
                    }
                    // else fall through, return FALSE
                    U_FALLTHROUGH;
                }
            default:
                break;
        }
    }
    return FALSE;
}